

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O0

pair<const_int_*,_unsigned_long> __thiscall
poplar::plain_bonsai_nlm<int>::compare(plain_bonsai_nlm<int> *this,uint64_t pos,char_range *key)

{
  unsigned_long uVar1;
  bool bVar2;
  uint8_t uVar3;
  uint64_t uVar4;
  char_range *in_RDX;
  size_type in_RSI;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t i;
  uint8_t *ptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff90;
  int *piVar5;
  uint64_t local_60;
  int *local_58;
  void *local_50;
  unsigned_long local_48;
  int local_3c;
  int *local_38;
  int *local_30;
  char_range *local_28;
  pair<const_int_*,_unsigned_long> local_10;
  
  local_28 = in_RDX;
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::operator[](in_RDI,in_RSI);
  local_30 = (int *)std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                              (in_stack_ffffffffffffff90);
  bVar2 = char_range::empty(local_28);
  if (bVar2) {
    local_38 = local_30;
    local_3c = 0;
    std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_int,_true>
              (&local_10,&local_38,&local_3c);
  }
  else {
    for (local_48 = 0; uVar1 = local_48, uVar4 = char_range::length(local_28), uVar1 < uVar4;
        local_48 = local_48 + 1) {
      uVar3 = char_range::operator[](local_28,local_48);
      if (uVar3 != *(uint8_t *)((long)local_30 + local_48)) {
        local_50 = (void *)0x0;
        std::pair<const_int_*,_unsigned_long>::pair<std::nullptr_t,_unsigned_long_&,_true>
                  (&local_10,&local_50,&local_48);
        return local_10;
      }
    }
    piVar5 = local_30;
    uVar4 = char_range::length(local_28);
    local_58 = (int *)((long)piVar5 + uVar4);
    local_60 = char_range::length(local_28);
    std::pair<const_int_*,_unsigned_long>::pair<const_int_*,_unsigned_long,_true>
              (&local_10,&local_58,&local_60);
  }
  return local_10;
}

Assistant:

std::pair<const value_type*, uint64_t> compare(uint64_t pos, const char_range& key) const {
        assert(pos < ptrs_.size());
        assert(ptrs_[pos]);

        const uint8_t* ptr = ptrs_[pos].get();

        if (key.empty()) {
            return {reinterpret_cast<const value_type*>(ptr), 0};
        }

        for (uint64_t i = 0; i < key.length(); ++i) {
            if (key[i] != ptr[i]) {
                return {nullptr, i};
            }
        }

        return {reinterpret_cast<const value_type*>(ptr + key.length()), key.length()};
    }